

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O2

Error asmjit::Logging::formatRegister
                (StringBuilder *sb,uint32_t logOptions,CodeEmitter *emitter,uint32_t archType,
                uint32_t regType,uint32_t regId)

{
  long lVar1;
  Error EVar2;
  undefined8 in_RAX;
  ulong uVar3;
  char *pcVar4;
  char *pcVar5;
  
  if (regId < 0x100) {
    if (regType < 0x20) {
      uVar3 = (ulong)regType;
      if (regId < (byte)x86RegFormatInfo[uVar3 * 4 + 3]) {
        pcVar5 = x86RegFormatStrings +
                 (ulong)regId * 4 + (ulong)(byte)x86RegFormatInfo[uVar3 * 4 + 2];
        goto LAB_0011e917;
      }
      if (regId < (byte)x86RegFormatInfo[uVar3 * 4]) {
        pcVar5 = x86RegFormatStrings + (byte)x86RegFormatInfo[uVar3 * 4 + 1];
        pcVar4 = (char *)(ulong)regId;
        goto LAB_0011e960;
      }
    }
    pcVar5 = "PhysReg<Type=%u Id=%u>";
  }
  else {
    if (((emitter != (CodeEmitter *)0x0) && (emitter->_type == '\x03')) &&
       (pcVar4 = (char *)(ulong)(regId - 0x100), pcVar4 < emitter[3]._inlineComment)) {
      if (regId == 0xffffffff) {
        DebugUtils::assertionFailed
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/hypeartist[P]asmjit-1/src/asmjit/x86/../base/codecompiler.h"
                   ,0x2a6,"id != kInvalidValue");
      }
      lVar1 = *(long *)(*(long *)&emitter[3]._globalOptions + (long)pcVar4 * 8);
      if (lVar1 == 0) {
        DebugUtils::assertionFailed
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/hypeartist[P]asmjit-1/src/asmjit/x86/x86logging.cpp"
                   ,0x222,"vReg != nullptr");
      }
      pcVar5 = *(char **)(lVar1 + 8);
      if ((pcVar5 == (char *)0x0) || (*pcVar5 == '\0')) {
        pcVar5 = "v%u";
LAB_0011e960:
        EVar2 = StringBuilder::appendFormat(sb,pcVar5,pcVar4,in_RAX);
        return EVar2;
      }
LAB_0011e917:
      EVar2 = StringBuilder::_opString(sb,1,pcVar5,0xffffffffffffffff);
      return EVar2;
    }
    pcVar5 = "VirtReg<Type=%u Id=%u>";
  }
  EVar2 = StringBuilder::appendFormat(sb,pcVar5,regType,(ulong)regId,in_RAX);
  return EVar2;
}

Assistant:

Error Logging::formatRegister(
  StringBuilder& sb,
  uint32_t logOptions,
  const CodeEmitter* emitter,
  uint32_t archType,
  uint32_t regType,
  uint32_t regId) noexcept {

#if defined(ASMJIT_BUILD_X86)
  return X86Logging::formatRegister(sb, logOptions, emitter, archType, regType, regId);
#endif // ASMJIT_BUILD_X86

#if defined(ASMJIT_BUILD_ARM)
  return ArmLogging::formatRegister(sb, logOptions, emitter, archType, regType, regId);
#endif // ASMJIT_BUILD_ARM

  return kErrorInvalidArch;
}